

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

size_t __thiscall Memory::Recycler::RescanMark(Recycler *this,DWORD waitTime)

{
  byte bVar1;
  ObservableValueObserver<Memory::CollectionState> *pOVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  size_t sVar9;
  CollectionState local_34;
  AutoFilterExceptionRegion local_30;
  AutoFilterExceptionRegion local_2c;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  AutoFilterExceptionRegion __autoFilterExceptionRegion_1;
  
  bVar5 = this->needOOMRescan;
  if ((this->inPartialCollectMode == false) && (bVar4 = DoQueueTrackedObject(this), !bVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x966,"(this->inPartialCollectMode || DoQueueTrackedObject())",
                       "this->inPartialCollectMode || DoQueueTrackedObject()");
    if (!bVar4) goto LAB_0071845a;
    *puVar8 = 0;
  }
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_30,ExceptionType_All);
  (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[2])();
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_30);
  if ((this->collectionState).value != CollectionStateRescanFindRoots) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x973,"(collectionState == CollectionStateRescanFindRoots)",
                       "collectionState == CollectionStateRescanFindRoots");
    if (!bVar4) goto LAB_0071845a;
    *puVar8 = 0;
  }
  if ((bVar5 == false) &&
     (((bVar5 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Force,BackgroundFinishMarkPhase),
       waitTime != 0xffffffff || (bVar5)) &&
      (bVar1 = this->backgroundFinishMarkCount,
      uVar6 = RecyclerHeuristic::MaxBackgroundFinishMarkCount(this->recyclerFlagsTable),
      bVar1 < uVar6)))) {
    PrepareBackgroundFindRoots(this);
    bVar5 = StartConcurrent(this,CollectionStateConcurrentFinishMark);
    if (bVar5) {
      this->backgroundFinishMarkCount = this->backgroundFinishMarkCount + '\x01';
      HeapInfoManager::PrepareSweep(&this->autoHeap);
      BVar7 = WaitForConcurrentThread(this,waitTime,WaitReasonNone);
      if (BVar7 == 0) {
        bVar5 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,BackgroundFinishMarkPhase);
        if (bVar5) {
          Output::Print(L"Finish mark timed out\n");
          Output::Flush();
        }
        AutoFilterExceptionRegion::AutoFilterExceptionRegion(&local_2c,ExceptionType_All);
        (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[4])();
        AutoFilterExceptionRegion::~AutoFilterExceptionRegion(&local_2c);
        return 0xffffffffffffffff;
      }
      if ((this->collectionState).value != CollectionStateRescanWait) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x98f,"(collectionState == CollectionStateRescanWait)",
                           "collectionState == CollectionStateRescanWait");
        if (!bVar5) {
LAB_0071845a:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      local_34 = CollectionStateRescanFindRoots;
      pOVar2 = (this->collectionState).observer;
      if ((pOVar2 != (ObservableValueObserver<Memory::CollectionState> *)0x0) &&
         ((this->collectionState).value != CollectionStateRescanFindRoots)) {
        (**pOVar2->_vptr_ObservableValueObserver)(pOVar2,&local_34,&this->collectionState);
      }
      (this->collectionState).value = local_34;
      return this->backgroundRescanRootBytes;
    }
    RevertPrepareBackgroundFindRoots(this);
  }
  this->backgroundFinishMarkCount = '\0';
  sVar9 = FinishMarkRescan(this,false);
  return sVar9 << 0xc;
}

Assistant:

size_t
Recycler::RescanMark(DWORD waitTime)
{
    bool const onLowMemory = this->NeedOOMRescan();

    // REVIEW: Why are we asserting for DoQueueTrackedObject here?
    // Should we split this into different asserts depending on whether
    // concurrent or partial is enabled?
#if ENABLE_CONCURRENT_GC
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || DoQueueTrackedObject());
#else
    Assert(DoQueueTrackedObject());
#endif
#endif

    {
        // We are about to do a rescan mark, which for consistency requires the runtime to stop any additional mutator threads
        AUTO_NO_EXCEPTION_REGION;
        collectionWrapper->PreRescanMarkCallback();
    }

    // Always called in-thread
    Assert(collectionState == CollectionStateRescanFindRoots);
#if ENABLE_CONCURRENT_GC
    if (!onLowMemory && // Don't do background finish mark if we are low on memory
        // Only do background finish mark if we have a time limit or it is forced
        (CUSTOM_PHASE_FORCE1(GetRecyclerFlagsTable(), Js::BackgroundFinishMarkPhase) || waitTime != INFINITE) &&
        // Don't do background finish mark if we failed to finish mark too many times
        (this->backgroundFinishMarkCount < RecyclerHeuristic::MaxBackgroundFinishMarkCount(this->GetRecyclerFlagsTable())))
    {
        this->PrepareBackgroundFindRoots();
        if (StartConcurrent(CollectionStateConcurrentFinishMark))
        {
            this->backgroundFinishMarkCount++;
            this->PrepareSweep();
            GCETW(GC_RESCANMARKWAIT_START, (this, waitTime));
            const BOOL waited = WaitForConcurrentThread(waitTime, RecyclerWaitReason::RescanMark);
            GCETW(GC_RESCANMARKWAIT_STOP, (this, !waited));
            if (!waited)
            {
                CUSTOM_PHASE_PRINT_TRACE1(GetRecyclerFlagsTable(), Js::BackgroundFinishMarkPhase, _u("Finish mark timed out\n"));

                {
                    // We timed out doing the finish mark, notify the runtime
                    AUTO_NO_EXCEPTION_REGION;
                    collectionWrapper->RescanMarkTimeoutCallback();
                }

                return Recycler::InvalidScanRootBytes;
            }
            Assert(collectionState == CollectionStateRescanWait);
            this->SetCollectionState(CollectionStateRescanFindRoots);
#ifdef RECYCLER_WRITE_WATCH
            if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
            {
                Assert(autoHeap.GetWriteWatchPageCount() == 0);
            }
#endif
            return this->backgroundRescanRootBytes;
        }
        this->RevertPrepareBackgroundFindRoots();
    }
#endif
#if ENABLE_CONCURRENT_GC
    this->backgroundFinishMarkCount = 0;
#endif
    return FinishMarkRescan(false) * AutoSystemInfo::PageSize;
}